

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O3

bool __thiscall sc_core::sc_trace_file_base::initialize(sc_trace_file_base *this)

{
  undefined1 uVar1;
  char *pcVar2;
  value_type vVar3;
  value_type vVar4;
  ostream *poVar5;
  sc_time_tuple kernel_res_tuple;
  stringstream ss;
  sc_time_tuple local_1d0;
  sc_time local_1c0 [2];
  char local_1b0 [16];
  EVP_PKEY_CTX *local_1a0 [2];
  ostream local_190 [376];
  
  if (this->initialized_ == false) {
    this->initialized_ = true;
    if (tracing_initialized_ == '\0') {
      tracing_initialized_ = '\x01';
      pcVar2 = getenv("SYSTEMC_REGRESSION");
      if (pcVar2 != (char *)0x0) {
        sc_report_handler::set_actions("default timescale unit used for tracing",SC_INFO,1);
      }
    }
    if (this->fp == (FILE *)0x0) {
      open_fp(this);
    }
    sc_get_time_resolution();
    local_1d0.m_value = 0;
    local_1d0.m_unit = SC_SEC;
    local_1d0.m_offset = 1;
    if (local_1a0[0] != SC_ZERO_TIME) {
      sc_time_tuple::init(&local_1d0,local_1a0[0]);
    }
    vVar3 = sc_time_tuple::value(&local_1d0);
    vVar4 = unit_to_fs(local_1d0.m_unit);
    this->kernel_unit_fs = vVar4 * vVar3;
    if (this->timescale_set_by_user == false) {
      this->trace_unit_fs = vVar4 * vVar3;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
      sc_get_time_resolution();
      sc_time::print(local_1c0,local_190);
      std::__ostream_insert<char,std::char_traits<char>>(local_190," (",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_190,(this->filename_)._M_dataplus._M_p,
                          (this->filename_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::__cxx11::stringbuf::str();
      sc_report_handler::report
                (SC_INFO,"default timescale unit used for tracing",(char *)local_1c0[0].m_value,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
                 ,0xa8);
      if ((char *)local_1c0[0].m_value != local_1b0) {
        operator_delete((void *)local_1c0[0].m_value);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    }
    (*(this->super_sc_trace_file)._vptr_sc_trace_file[0x23])(this);
    uVar1 = this->initialized_;
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool
sc_trace_file_base::initialize()
{
    if( initialized_ )
      return false;

    initialized_ = true;

    if( !tracing_initialized_ ) {
        tracing_initialized_ = true;
        bool running_regression = ( getenv( "SYSTEMC_REGRESSION" ) != NULL );

        // hide some messages during regression
        if( running_regression ) {
          sc_report_handler::set_actions( SC_ID_TRACING_TIMESCALE_DEFAULT_
                                        , SC_INFO,    SC_DO_NOTHING );
        }
    }

    // open trace file
    if(!fp) open_fp();

    sc_time_tuple kernel_res_tuple = sc_time_tuple(sc_get_time_resolution());
    kernel_unit_fs = kernel_res_tuple.value() * unit_to_fs(kernel_res_tuple.unit());

    // setup timescale
    if( !timescale_set_by_user )
    {
        trace_unit_fs = kernel_unit_fs;

        std::stringstream ss;
        ss << sc_get_time_resolution() << " (" << filename_ << ")";
        SC_REPORT_INFO( SC_ID_TRACING_TIMESCALE_DEFAULT_
                      , ss.str().c_str() );
    }

    // initialize derived tracing implementation class (VCD/WIF)
    do_initialize();

    return initialized_;
}